

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::cbow
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  pointer piVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  int32_t w;
  ulong uVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> bow;
  uniform_int_distribution<int> uniform;
  _Vector_base<int,_std::allocator<int>_> local_68;
  State *local_48;
  minstd_rand *local_40;
  uniform_int_distribution<int> local_38;
  
  local_68._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  local_68._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_38._M_param._M_a = 1;
  local_40 = &state->rng;
  local_48 = state;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_38,local_40);
    if (local_68._M_impl.super__Vector_impl_data._M_finish !=
        local_68._M_impl.super__Vector_impl_data._M_start) {
      local_68._M_impl.super__Vector_impl_data._M_finish =
           local_68._M_impl.super__Vector_impl_data._M_start;
    }
    for (iVar6 = -rVar2; iVar6 <= rVar2; iVar6 = iVar6 + 1) {
      if ((iVar6 != 0) && (uVar3 = (int)uVar5 + iVar6, -1 < (int)uVar3)) {
        piVar1 = (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)uVar3 <
            (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
          pvVar4 = Dictionary::getSubwords
                             ((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,piVar1[uVar3]);
          std::vector<int,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                    ((vector<int,std::allocator<int>> *)&local_68,
                     (const_iterator)local_68._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
        }
      }
    }
    Model::update((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,(vector<int,_std::allocator<int>_> *)&local_68,line,(int)uVar5,lr,local_48)
    ;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void FastText::cbow(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::vector<int32_t> bow;
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    bow.clear();
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w + c]);
        bow.insert(bow.end(), ngrams.cbegin(), ngrams.cend());
      }
    }
    model_->update(bow, line, w, lr, state);
  }
}